

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_constraints.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBConstraintsInit(ClientContext *context,TableFunctionInitInput *input)

{
  long lVar1;
  undefined8 *puVar2;
  _Head_base<0UL,_duckdb::DuckDBConstraintsData_*,_false> _Var3;
  undefined8 *puVar4;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> _Var5;
  ulong uVar6;
  pointer pDVar7;
  __normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
  __i;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  pointer prVar11;
  templated_unique_single_t result;
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> entries;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  _Head_base<0UL,_duckdb::DuckDBConstraintsData_*,_false> local_a0;
  undefined8 *local_98;
  undefined8 *puStack_90;
  undefined8 local_88;
  undefined8 **local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> local_58;
  pointer local_50;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> local_48;
  
  local_58._M_head_impl = (GlobalTableFunctionState *)context;
  local_a0._M_head_impl = (DuckDBConstraintsData *)operator_new(0x70);
  ((local_a0._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__DuckDBConstraintsData_024804d8;
  ((local_a0._M_head_impl)->entries).
  super_vector<duckdb::ConstraintEntry,_std::allocator<duckdb::ConstraintEntry>_>.
  super__Vector_base<duckdb::ConstraintEntry,_std::allocator<duckdb::ConstraintEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_a0._M_head_impl)->entries).
  super_vector<duckdb::ConstraintEntry,_std::allocator<duckdb::ConstraintEntry>_>.
  super__Vector_base<duckdb::ConstraintEntry,_std::allocator<duckdb::ConstraintEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_a0._M_head_impl)->entries).
  super_vector<duckdb::ConstraintEntry,_std::allocator<duckdb::ConstraintEntry>_>.
  super__Vector_base<duckdb::ConstraintEntry,_std::allocator<duckdb::ConstraintEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_a0._M_head_impl)->offset = 0;
  (local_a0._M_head_impl)->constraint_offset = 0;
  (local_a0._M_head_impl)->unique_constraint_offset = 0;
  ((local_a0._M_head_impl)->constraint_names)._M_h._M_buckets =
       &((local_a0._M_head_impl)->constraint_names)._M_h._M_single_bucket;
  ((local_a0._M_head_impl)->constraint_names)._M_h._M_bucket_count = (size_type)&DAT_00000001;
  ((local_a0._M_head_impl)->constraint_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((local_a0._M_head_impl)->constraint_names)._M_h._M_element_count = 0;
  ((local_a0._M_head_impl)->constraint_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ((local_a0._M_head_impl)->constraint_names)._M_h._M_rehash_policy._M_next_resize = 0;
  ((local_a0._M_head_impl)->constraint_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Catalog::GetAllSchemas(&local_48,(ClientContext *)input);
  local_50 = local_48.
             super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    prVar11 = local_48.
              super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_98 = (undefined8 *)0x0;
      puStack_90 = (undefined8 *)0x0;
      local_88 = 0;
      uStack_70 = 0;
      local_78 = &local_98;
      pcStack_60 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/function/table/system/duckdb_constraints.cpp:105:56)>
                   ::_M_invoke;
      local_68 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/function/table/system/duckdb_constraints.cpp:105:56)>
                 ::_M_manager;
      (*(prVar11->_M_data->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                (prVar11->_M_data,input,1,&local_78);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      puVar4 = puStack_90;
      puVar10 = local_98;
      puVar2 = puStack_90;
      if (local_98 != puStack_90) {
        lVar8 = (long)puStack_90 - (long)local_98;
        uVar6 = lVar8 >> 3;
        lVar1 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        ::std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBConstraintsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__1>>
                  (local_98,puStack_90,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar8 < 0x81) {
          ::std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBConstraintsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__1>>
                    (puVar10,puVar4);
          puVar10 = local_98;
          puVar2 = puStack_90;
        }
        else {
          puVar9 = puVar10 + 0x10;
          ::std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBConstraintsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__1>>
                    (puVar10,puVar9);
          for (; puVar10 = local_98, puVar2 = puStack_90, puVar9 != puVar4; puVar9 = puVar9 + 1) {
            ::std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Val_comp_iter<duckdb::DuckDBConstraintsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__1>>
                      (puVar9);
          }
        }
      }
      for (; puVar10 != puVar2; puVar10 = puVar10 + 1) {
        pDVar7 = unique_ptr<duckdb::DuckDBConstraintsData,_std::default_delete<duckdb::DuckDBConstraintsData>,_true>
                 ::operator->((unique_ptr<duckdb::DuckDBConstraintsData,_std::default_delete<duckdb::DuckDBConstraintsData>,_true>
                               *)&local_a0);
        ::std::vector<duckdb::ConstraintEntry,std::allocator<duckdb::ConstraintEntry>>::
        emplace_back<duckdb::ClientContext&,duckdb::TableCatalogEntry&>
                  ((vector<duckdb::ConstraintEntry,std::allocator<duckdb::ConstraintEntry>> *)
                   &pDVar7->entries,(ClientContext *)input,(TableCatalogEntry *)*puVar10);
      }
      if (local_98 != (undefined8 *)0x0) {
        operator_delete(local_98);
      }
      prVar11 = prVar11 + 1;
    } while (prVar11 != local_50);
  }
  _Var5._M_head_impl = local_58._M_head_impl;
  _Var3._M_head_impl = local_a0._M_head_impl;
  local_a0._M_head_impl = (DuckDBConstraintsData *)0x0;
  (local_58._M_head_impl)->_vptr_GlobalTableFunctionState = (_func_int **)_Var3._M_head_impl;
  if (local_48.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0._M_head_impl != (DuckDBConstraintsData *)0x0) {
    (*((local_a0._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])()
    ;
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )_Var5._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBConstraintsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBConstraintsData>();

	// scan all the schemas for tables and collect them
	auto schemas = Catalog::GetAllSchemas(context);

	for (auto &schema : schemas) {
		vector<reference<CatalogEntry>> entries;

		schema.get().Scan(context, CatalogType::TABLE_ENTRY, [&](CatalogEntry &entry) {
			if (entry.type == CatalogType::TABLE_ENTRY) {
				entries.push_back(entry);
			}
		});

		sort(entries.begin(), entries.end(), [&](CatalogEntry &x, CatalogEntry &y) { return (x.name < y.name); });
		for (auto &entry : entries) {
			result->entries.emplace_back(context, entry.get().Cast<TableCatalogEntry>());
		}
	};

	return std::move(result);
}